

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool string_contains(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  char *pcVar1;
  undefined6 in_register_00000012;
  _Bool _Var2;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1018 [4096];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_string)) {
    pcVar1 = string_strnstr((char *)((args->field_1).p)->objclass,
                            (char *)(args[1].field_1.p)->objclass,
                            (ulong)*(uint *)((long)&((args->field_1).p)->identifier + 4));
    value_00.field_1.n._0_1_ = pcVar1 != (char *)0x0;
    value_00.isa = gravity_class_bool;
    value_00.field_1.n._1_7_ = 0;
    gravity_vm_setslot(vm,value_00,rindex);
    _Var2 = true;
  }
  else {
    builtin_strncpy(local_1018 + 0x10,"xpects a string as an argument",0x1f);
    builtin_strncpy(local_1018,"String.index() e",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1018);
    _Var2 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  return _Var2;
}

Assistant:

static bool string_contains (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm)
    
    // sanity check
    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) {
        RETURN_ERROR("String.index() expects a string as an argument");
    }
    
    gravity_string_t *main_str = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *str_to_index = VALUE_AS_STRING(GET_VALUE(1));
    
    // search for the string
    char *ptr = string_strnstr(main_str->s, str_to_index->s, (size_t)main_str->len);
    
    // return a Bool value
    RETURN_VALUE(VALUE_FROM_BOOL(ptr != NULL), rindex);
}